

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::swizzle
               (ConstPixelBufferAccess *src,PixelBufferAccess *dst,VkComponentMapping *swz)

{
  VkComponentSwizzle VVar1;
  ConstPixelBufferAccess *pCVar2;
  bool bVar3;
  TextureChannelClass TVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vector<int,_4> res;
  undefined1 local_78 [20];
  ChannelType local_64;
  int local_60;
  int local_5c;
  VkComponentMapping *local_58;
  ConstPixelBufferAccess *local_50;
  PixelBufferAccess *local_48;
  
  TVar4 = tcu::getTextureChannelClass((dst->super_ConstPixelBufferAccess).m_format.type);
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]) {
      iVar5 = 0;
      do {
        if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
          iVar6 = 0;
          do {
            if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]) {
              iVar7 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                          ((ConstPixelBufferAccess *)local_78,(int)src,iVar7,iVar6);
                VVar1 = swz->r;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_78._16_4_ = A;
                }
                else {
                  local_78._16_4_ = R;
                  if ((VVar1 != VK_COMPONENT_SWIZZLE_ZERO) &&
                     (local_78._16_4_ = local_78._0_4_, VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY)) {
                    local_78._16_4_ =
                         *(ChannelOrder *)
                          (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = swz->g;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_64 = SNORM_INT16;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_64 = SNORM_INT8;
                }
                else {
                  local_64 = local_78._4_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_64 = *(ChannelType *)
                                (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = swz->b;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_60 = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_60 = 0;
                }
                else {
                  local_60 = local_78._8_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_60 = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = swz->a;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_5c = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_5c = 0;
                }
                else {
                  local_5c = local_78._12_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_5c = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                tcu::PixelBufferAccess::setPixel(dst,(IVec4 *)(local_78 + 0x10),iVar7,iVar6,iVar5);
                iVar7 = iVar7 + 1;
              } while (iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]);
    }
  }
  else if (TVar4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]) {
      iVar5 = 0;
      do {
        if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
          iVar6 = 0;
          do {
            if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]) {
              iVar7 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<int>
                          ((ConstPixelBufferAccess *)local_78,(int)src,iVar7,iVar6);
                VVar1 = swz->r;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_78._16_4_ = A;
                }
                else {
                  local_78._16_4_ = R;
                  if ((VVar1 != VK_COMPONENT_SWIZZLE_ZERO) &&
                     (local_78._16_4_ = local_78._0_4_, VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY)) {
                    local_78._16_4_ =
                         *(ChannelOrder *)
                          (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = swz->g;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_64 = SNORM_INT16;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_64 = SNORM_INT8;
                }
                else {
                  local_64 = local_78._4_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_64 = *(ChannelType *)
                                (local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = swz->b;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_60 = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_60 = 0;
                }
                else {
                  local_60 = local_78._8_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_60 = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                VVar1 = swz->a;
                if (VVar1 == VK_COMPONENT_SWIZZLE_ONE) {
                  local_5c = 1;
                }
                else if (VVar1 == VK_COMPONENT_SWIZZLE_ZERO) {
                  local_5c = 0;
                }
                else {
                  local_5c = local_78._12_4_;
                  if (VVar1 != VK_COMPONENT_SWIZZLE_IDENTITY) {
                    local_5c = *(int *)(local_78 + (long)(int)(VVar1 - VK_COMPONENT_SWIZZLE_R) * 4);
                  }
                }
                tcu::PixelBufferAccess::setPixel(dst,(IVec4 *)(local_78 + 0x10),iVar7,iVar6,iVar5);
                iVar7 = iVar7 + 1;
              } while (iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]);
    }
  }
  else {
    bVar3 = tcu::isSRGB(src->m_format);
    local_50 = src;
    local_58 = swz;
    if ((!bVar3) ||
       (bVar3 = tcu::isSRGB((dst->super_ConstPixelBufferAccess).m_format), pCVar2 = local_50, bVar3)
       ) {
      pCVar2 = local_50;
      if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]) {
        iVar5 = 0;
        do {
          if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
            iVar6 = 0;
            do {
              if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]) {
                iVar7 = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixelT<float>
                            ((ConstPixelBufferAccess *)local_78,(int)pCVar2,iVar7,iVar6);
                  swizzle<float>((Vector<float,_4> *)local_78,local_58);
                  tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)(local_78 + 0x10),iVar7,iVar6,iVar5);
                  iVar7 = iVar7 + 1;
                } while (iVar7 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]);
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]);
      }
    }
    else if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]) {
      iVar5 = 0;
      local_48 = dst;
      do {
        if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
          iVar6 = 0;
          do {
            if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]) {
              iVar7 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelT<float>
                          ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)pCVar2,iVar7,
                           iVar6);
                tcu::sRGBToLinear((tcu *)local_78,(Vec4 *)&stack0xffffffffffffffc0);
                swizzle<float>((Vector<float,_4> *)local_78,local_58);
                tcu::PixelBufferAccess::setPixel
                          (local_48,(Vec4 *)(local_78 + 0x10),iVar7,iVar6,iVar5);
                iVar7 = iVar7 + 1;
                dst = local_48;
              } while (iVar7 < (local_48->super_ConstPixelBufferAccess).m_size.m_data[0]);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]);
    }
  }
  return;
}

Assistant:

void swizzle (const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& dst, const vk::VkComponentMapping& swz)
{
	const tcu::TextureChannelClass	chnClass	= tcu::getTextureChannelClass(dst.getFormat().type);

	DE_ASSERT(src.getWidth() == dst.getWidth() &&
			  src.getHeight() == dst.getHeight() &&
			  src.getDepth() == dst.getDepth());

	if (chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		swizzleT<deInt32>(src, dst, swz);
	else if (chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		swizzleT<deUint32>(src, dst, swz);
	else if (tcu::isSRGB(src.getFormat()) && !tcu::isSRGB(dst.getFormat()))
		swizzleFromSRGB(src, dst, swz);
	else
		swizzleT<float>(src, dst, swz);
}